

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void cppcms::json::anon_unknown_9::indent(ostream *out,char c,int *tabs)

{
  ostream *poVar1;
  int iVar2;
  
  if (*tabs < 0) {
    std::operator<<(out,c);
    return;
  }
  if (c == ',') {
    poVar1 = std::operator<<(out,',');
LAB_0021cb93:
    std::operator<<(poVar1,'\n');
    iVar2 = *tabs;
  }
  else {
    if (c == ':') {
      std::operator<<(out," :\t");
      return;
    }
    if (c != '[') {
      if ((c == ']') || (c == '}')) {
        std::operator<<(out,'\n');
        iVar2 = *tabs;
        *tabs = iVar2 + -1;
        pad(out,iVar2 + -1);
        poVar1 = std::operator<<(out,c);
        goto LAB_0021cb93;
      }
      if (c != '{') {
        return;
      }
    }
    poVar1 = std::operator<<(out,c);
    std::operator<<(poVar1,'\n');
    iVar2 = *tabs + 1;
    *tabs = iVar2;
  }
  pad(out,iVar2);
  return;
}

Assistant:

void indent(std::ostream &out,char c,int &tabs)
		{
			if(tabs < 0) {
				out<<c;
				return;
			}
			switch(c) {
			case '{':
			case '[':
				out<<c<<'\n';
				tabs++;
				pad(out,tabs);
				break;
			case ',':
				out<<c<<'\n';
				pad(out,tabs);
				break;
			case ':':
				out<<" :\t";
				break;
			case '}':
			case ']':
				out<<'\n';
				tabs--;
				pad(out,tabs);
				out<<c<<'\n';
				pad(out,tabs);
				break;
			}
		}